

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::create_response_map(Surf *this,int o,int k)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImageBase *pIVar5;
  element_type *peVar6;
  float *pfVar7;
  SatType SVar8;
  SatType SVar9;
  SatType SVar10;
  reference this_00;
  reference this_01;
  RespType dxy_t;
  RespType dyy_t;
  RespType dxx_t;
  SatType dxy;
  SatType dyy;
  SatType dxx;
  int local_60;
  int local_5c;
  int x;
  int i_1;
  int y;
  int border;
  Ptr img;
  int i;
  int oh;
  int ow;
  int h;
  int w;
  RespType inv_karea;
  RespType weight;
  int local_1c;
  int step;
  int fs;
  int k_local;
  int o_local;
  Surf *this_local;
  
  local_1c = *(int *)((anonymous_namespace)::kernel_sizes + (long)k * 4 + (long)o * 0x10);
  inv_karea = 2.8026e-45;
  step = k;
  fs = o;
  _k_local = this;
  weight = (RespType)math::fastpow<int>((int *)&inv_karea,o);
  fVar1 = 1.0 / (float)(local_1c * (local_1c * 2 + -1));
  pIVar5 = (ImageBase *)
           std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  iVar2 = core::ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  iVar3 = core::ImageBase::height(pIVar5);
  img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       iVar3;
  i = iVar2;
  for (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _0_4_ = 0;
      (int)img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      < fs; img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._0_4_ = (int)img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1) {
    i = i + 1 >> 1;
    img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _4_4_ + 1 >> 1;
  }
  core::Image<float>::create
            ((Image<float> *)&y,i,
             img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_,1);
  iVar4 = local_1c + local_1c / 2 + 1;
  local_5c = 0;
  for (x = 0; x < iVar3; x = (int)weight + x) {
    for (local_60 = 0; local_60 < iVar2; local_60 = (int)weight + local_60) {
      if ((((local_60 < iVar4) || (iVar2 <= local_60 + iVar4)) || (x < iVar4)) ||
         (iVar3 <= x + iVar4)) {
        peVar6 = std::
                 __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&y);
        pfVar7 = core::Image<float>::at(peVar6,local_5c);
        *pfVar7 = 0.0;
      }
      else {
        SVar8 = filter_dxx(this,local_1c,local_60,x);
        SVar9 = filter_dyy(this,local_1c,local_60,x);
        SVar10 = filter_dxy(this,local_1c,local_60,x);
        peVar6 = std::
                 __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&y);
        pfVar7 = core::Image<float>::at(peVar6,local_5c);
        *pfVar7 = (float)SVar8 * fVar1 * (float)SVar9 * fVar1 +
                  (float)SVar10 * fVar1 * -0.912 * (float)SVar10 * fVar1;
      }
      local_5c = local_5c + 1;
    }
  }
  this_00 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::operator[]
                      (&this->octaves,(long)fs);
  this_01 = std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::operator[](&this_00->imgs,(long)step);
  std::shared_ptr<core::Image<float>_>::operator=(this_01,(shared_ptr<core::Image<float>_> *)&y);
  std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)&y);
  return;
}

Assistant:

void
Surf::create_response_map (int o, int k)
{
    /*
     * In order to create the Hessian response map for filter size 'fs',
     * we need to convolute the image with second order Gaussian partial
     * derivative filters Dxx, Dyy and Dxy and compute the response
     * as det(H) = Dxx * Dyy - w * Dxy * Dxy, where w = 0.81.
     * So we need to compute Dxx, Dyy and Dxy with filter size 'fs'.
     * Note: filter size 'fs' is defined as filter width / 3.
     * For details, see SURF 3.2.
     */
    typedef Octave::RespType RespType;

    /* Filter size. The actual kernel side length is 3 * fs. */
    int const fs = kernel_sizes[o][k];
    /* The sample spacing for the octaves. */
    int const step = math::fastpow(2, o);
    /* Weight to balance between real gaussian kernel and approximated one. */
    RespType const weight = 0.912;  // See SURF 3.3 (4).
    /* NormalizationKernel width is 3 * fs, height is 2 * fs - 1. */
    RespType const inv_karea = 1.0 / (fs * (2 * fs - 1));

    /* Original dimensions and octave dimensions. */
    int const w = this->sat->width();
    int const h = this->sat->height();
    int ow = w;
    int oh = h;
    for (int i = 0; i < o; ++i)
    {
        ow = (ow + 1) >> 1;
        oh = (oh + 1) >> 1;
    }

    /* Generate the response maps. */
    Octave::RespImage::Ptr img = Octave::RespImage::create(ow, oh, 1);
    int const border = fs + fs / 2 + 1;
    for (int y = 0, i = 0; y < h; y += step)
        for (int x = 0; x < w; x += step, ++i)
        {
            if (x < border || x + border >= w || y < border || y + border >= h)
            {
                img->at(i) = 0.0f;
                continue;
            }

            SatType dxx = this->filter_dxx(fs, x, y);
            SatType dyy = this->filter_dyy(fs, x, y);
            SatType dxy = this->filter_dxy(fs, x, y);
            RespType dxx_t = static_cast<RespType>(dxx) * inv_karea;
            RespType dyy_t = static_cast<RespType>(dyy) * inv_karea;
            RespType dxy_t = static_cast<RespType>(dxy) * inv_karea;
            /* Compute the determinant of the hessian. */
            img->at(i) = dxx_t * dyy_t - weight * dxy_t * dxy_t;
            /* The laplacian can be computed as dxx_t + dyy_t. */
            // float laplacian = dxx_t + dyy_t;
        }

    this->octaves[o].imgs[k] = img;
}